

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall
QWidgetPrivate::setLayoutDirection_helper(QWidgetPrivate *this,LayoutDirection direction)

{
  uint uVar1;
  QObject *pQVar2;
  QWidgetPrivate *d;
  long lVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  undefined1 *local_38;
  undefined1 *puStack_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = *(QObject **)&this->field_0x8;
  lVar3 = *(long *)(pQVar2 + 8);
  uVar1 = *(uint *)(lVar3 + 0x240);
  if ((direction == RightToLeft) != (bool)((byte)(uVar1 >> 0x18) & 1)) {
    *(uint *)(lVar3 + 0x240) = (uint)(direction == RightToLeft) << 0x18 | uVar1 & 0xfeffffff;
    if ((*(long *)&this->field_0x28 != 0) && (*(long *)&this->field_0x28 != 0)) {
      uVar4 = 0;
      do {
        lVar3 = *(long *)(*(long *)&this->field_0x20 + uVar4 * 8);
        if ((lVar3 == 0) || ((*(byte *)(*(long *)(lVar3 + 8) + 0x30) & 1) == 0)) {
          lVar3 = 0;
        }
        if (((lVar3 != 0) && ((*(byte *)(*(long *)(lVar3 + 0x20) + 0xc) & 1) == 0)) &&
           (((*(QWidgetPrivate **)(lVar3 + 8))->high_attributes[0] & 0x2000000) == 0)) {
          setLayoutDirection_helper(*(QWidgetPrivate **)(lVar3 + 8),direction);
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < *(ulong *)&this->field_0x28);
    }
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
    QEvent::QEvent((QEvent *)&local_38,LayoutDirectionChange);
    QCoreApplication::sendEvent(pQVar2,(QEvent *)&local_38);
    QEvent::~QEvent((QEvent *)&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::setLayoutDirection_helper(Qt::LayoutDirection direction)
{
    Q_Q(QWidget);

    if ( (direction == Qt::RightToLeft) == q->testAttribute(Qt::WA_RightToLeft))
        return;
    q->setAttribute(Qt::WA_RightToLeft, (direction == Qt::RightToLeft));
    if (!children.isEmpty()) {
        for (int i = 0; i < children.size(); ++i) {
            QWidget *w = qobject_cast<QWidget*>(children.at(i));
            if (w && !w->isWindow() && !w->testAttribute(Qt::WA_SetLayoutDirection))
                w->d_func()->setLayoutDirection_helper(direction);
        }
    }
    QEvent e(QEvent::LayoutDirectionChange);
    QCoreApplication::sendEvent(q, &e);
}